

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::php::anon_unknown_2::GenerateMessageDocComment
          (anon_unknown_2 *this,Printer *printer,Descriptor *message,Options *options)

{
  Descriptor *pDVar1;
  bool bVar2;
  MessageOptions *this_00;
  string_view sVar3;
  string_view input;
  string local_d0;
  string local_a0;
  undefined1 local_80 [16];
  string local_70;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  Descriptor *local_20;
  Options *options_local;
  Descriptor *message_local;
  Printer *printer_local;
  
  local_20 = message;
  options_local = (Options *)printer;
  message_local = (Descriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"/**\n");
  io::Printer::Print<>((Printer *)this,local_30);
  GenerateDocCommentBody<google::protobuf::Descriptor>
            ((Printer *)message_local,(Descriptor *)options_local);
  this_00 = Descriptor::options((Descriptor *)options_local);
  bVar2 = MessageOptions::deprecated(this_00);
  pDVar1 = message_local;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40," * @deprecated\n");
    io::Printer::Print<>((Printer *)pDVar1,local_40);
  }
  pDVar1 = message_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50," * Generated from protobuf message <code>^messagename^</code>\n */\n");
  FullClassName<google::protobuf::Descriptor>
            (&local_a0,(Descriptor *)options_local,(Options *)local_20);
  local_80 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
  sVar3._M_len = local_80._8_8_;
  sVar3._M_str = &options->is_descriptor;
  php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_(&local_70,local_80._0_8_,sVar3);
  sVar3 = Descriptor::full_name((Descriptor *)options_local);
  input._M_len = sVar3._M_str;
  input._M_str = (char *)sVar3._M_len;
  php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_
            (&local_d0,(_anonymous_namespace_ *)sVar3._M_len,input);
  io::Printer::Print<char[9],std::__cxx11::string,char[12],std::__cxx11::string>
            ((Printer *)pDVar1,local_50,(char (*) [9])"fullname",&local_70,
             (char (*) [12])"messagename",&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void GenerateMessageDocComment(io::Printer* printer, const Descriptor* message,
                               const Options& options) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, message);
  if (message->options().deprecated()) {
    printer->Print(" * @deprecated\n");
  }

  printer->Print(
      " * Generated from protobuf message <code>^messagename^</code>\n"
      " */\n",
      "fullname", EscapePhpdoc(FullClassName(message, options)), "messagename",
      EscapePhpdoc(message->full_name()));
}